

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  bool bVar1;
  int iVar2;
  
  if (IsReservedTarget(std::__cxx11::string_const&)::reservedTargets == '\0') {
    iVar2 = __cxa_guard_acquire(&IsReservedTarget(std::__cxx11::string_const&)::reservedTargets);
    if (iVar2 != 0) {
      IsReservedTarget::reservedTargets[0].super_string_view._M_len = 3;
      IsReservedTarget::reservedTargets[0].super_string_view._M_str = "all";
      IsReservedTarget::reservedTargets[1].super_string_view._M_len = 9;
      IsReservedTarget::reservedTargets[1].super_string_view._M_str = "ALL_BUILD";
      IsReservedTarget::reservedTargets[2].super_string_view._M_len = 4;
      IsReservedTarget::reservedTargets[2].super_string_view._M_str = "help";
      IsReservedTarget::reservedTargets[3].super_string_view._M_len = 7;
      IsReservedTarget::reservedTargets[3].super_string_view._M_str = "install";
      IsReservedTarget::reservedTargets[4].super_string_view._M_len = 7;
      IsReservedTarget::reservedTargets[4].super_string_view._M_str = "INSTALL";
      IsReservedTarget::reservedTargets[5].super_string_view._M_len = 10;
      IsReservedTarget::reservedTargets[5].super_string_view._M_str = "preinstall";
      IsReservedTarget::reservedTargets[6].super_string_view._M_len = 5;
      IsReservedTarget::reservedTargets[6].super_string_view._M_str = "clean";
      IsReservedTarget::reservedTargets[7].super_string_view._M_len = 10;
      IsReservedTarget::reservedTargets[7].super_string_view._M_str = "edit_cache";
      IsReservedTarget::reservedTargets[8].super_string_view._M_len = 0xd;
      IsReservedTarget::reservedTargets[8].super_string_view._M_str = "rebuild_cache";
      IsReservedTarget::reservedTargets[9].super_string_view._M_len = 10;
      IsReservedTarget::reservedTargets[9].super_string_view._M_str = "ZERO_CHECK";
      __cxa_guard_release(&IsReservedTarget(std::__cxx11::string_const&)::reservedTargets);
    }
  }
  bVar1 = ::cm::
          contains<cm::static_string_view[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&IsReservedTarget::reservedTargets,name);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  static const cm::static_string_view reservedTargets[] = {
    "all"_s,           "ALL_BUILD"_s,  "help"_s,  "install"_s,
    "INSTALL"_s,       "preinstall"_s, "clean"_s, "edit_cache"_s,
    "rebuild_cache"_s, "ZERO_CHECK"_s
  };

  return cm::contains(reservedTargets, name);
}